

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O0

void __thiscall draco::ObjEncoder::EncodeFloatList(ObjEncoder *this,float *vals,int num_vals)

{
  float in_EDX;
  ObjEncoder *in_RSI;
  ObjEncoder *in_RDI;
  char *unaff_retaddr;
  EncoderBuffer *in_stack_00000008;
  int i;
  undefined4 local_18;
  
  for (local_18 = 0; local_18 < (int)in_EDX; local_18 = local_18 + 1) {
    if (0 < local_18) {
      buffer(in_RDI);
      EncoderBuffer::Encode<char>(in_stack_00000008,unaff_retaddr);
    }
    EncodeFloat(in_RSI,in_EDX);
  }
  return;
}

Assistant:

void ObjEncoder::EncodeFloatList(float *vals, int num_vals) {
  for (int i = 0; i < num_vals; ++i) {
    if (i > 0) {
      buffer()->Encode(' ');
    }
    EncodeFloat(vals[i]);
  }
}